

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O2

void __thiscall Debugger::ClearCache(Debugger *this)

{
  lua_State *plVar1;
  int iVar2;
  
  plVar1 = this->currentL;
  if (plVar1 != (lua_State *)0x0) {
    (*lua_getfield)(plVar1,LUA_REGISTRYINDEX,"_emmy_cache_table_");
    iVar2 = (*lua_type)(plVar1,-1);
    if (iVar2 != 0) {
      (*lua_pushnil)(plVar1);
      (*lua_setfield)(plVar1,LUA_REGISTRYINDEX,"_emmy_cache_table_");
    }
    (*lua_settop)(plVar1,-2);
    return;
  }
  return;
}

Assistant:

void Debugger::ClearCache() const {
	if (!currentL) {
		return;
	}

	auto L = currentL;


	lua_getfield(L, LUA_REGISTRYINDEX, CACHE_TABLE_NAME);
	if (!lua_isnil(L, -1)) {
		lua_pushnil(L);
		lua_setfield(L, LUA_REGISTRYINDEX, CACHE_TABLE_NAME);
	}
	lua_pop(L, 1);
}